

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O0

void LEARNER::save(vw *all,example *ec)

{
  size_t sVar1;
  char *pcVar2;
  char **ppcVar3;
  ostream *poVar4;
  long in_RSI;
  example *in_RDI;
  string final_regressor_name;
  size_t in_stack_000000f0;
  string *in_stack_000000f8;
  vw *in_stack_00000100;
  vw *in_stack_ffffffffffffff30;
  string local_88 [39];
  allocator local_61;
  string local_60 [48];
  string local_30 [32];
  long local_10;
  example *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string
            (local_30,(string *)
                      &(in_RDI->super_example_predict).feature_space[0x83].values.erase_count);
  sVar1 = v_array<char>::size((v_array<char> *)(local_10 + 0x6878));
  if (5 < sVar1) {
    pcVar2 = v_array<char>::operator[]((v_array<char> *)(local_10 + 0x6878),4);
    if (*pcVar2 == '_') {
      ppcVar3 = v_array<char>::begin((v_array<char> *)(local_10 + 0x6878));
      pcVar2 = *ppcVar3;
      sVar1 = v_array<char>::size((v_array<char> *)(local_10 + 0x6878));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,pcVar2 + 5,sVar1 - 5,&local_61);
      std::__cxx11::string::operator=(local_30,local_60);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
  }
  if (((local_8->super_example_predict).feature_space[0x80].values.erase_count & 0x100) == 0) {
    poVar4 = std::operator<<((ostream *)
                             &(local_8->super_example_predict).feature_space[1].space_names.
                              erase_count,"saving regressor to ");
    in_stack_ffffffffffffff30 = (vw *)std::operator<<(poVar4,local_30);
    std::ostream::operator<<(in_stack_ffffffffffffff30,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string(local_88,local_30);
  save_predictor(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  std::__cxx11::string::~string(local_88);
  VW::finish_example(in_stack_ffffffffffffff30,local_8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void save(vw& all, example* ec)
{
  // save state command
  string final_regressor_name = all.final_regressor_name;

  if ((ec->tag).size() >= 6 && (ec->tag)[4] == '_')
    final_regressor_name = string(ec->tag.begin() + 5, (ec->tag).size() - 5);

  if (!all.quiet)
    all.trace_message << "saving regressor to " << final_regressor_name << endl;
  save_predictor(all, final_regressor_name, 0);

  VW::finish_example(all, *ec);
}